

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void s_RemoveDefineFlag(string *flag,string *dflags)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  size_type rpos;
  size_type lpos;
  size_type len;
  string *dflags_local;
  string *flag_local;
  
  lVar2 = std::__cxx11::string::length();
  rpos = std::__cxx11::string::find((string *)dflags,(ulong)flag);
  do {
    if (rpos == 0xffffffffffffffff) {
      return;
    }
    if (rpos == 0) {
LAB_005cf78f:
      uVar4 = std::__cxx11::string::size();
      if (rpos + lVar2 < uVar4) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)dflags);
        bVar1 = cmIsSpace(*pcVar3);
        if (!bVar1) goto LAB_005cf7e8;
      }
      std::__cxx11::string::erase((ulong)dflags,rpos);
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)dflags);
      bVar1 = cmIsSpace(*pcVar3);
      if (bVar1) goto LAB_005cf78f;
    }
LAB_005cf7e8:
    rpos = std::__cxx11::string::find((string *)dflags,(ulong)flag);
  } while( true );
}

Assistant:

static void s_RemoveDefineFlag(std::string const& flag, std::string& dflags)
{
  std::string::size_type const len = flag.length();
  // Remove all instances of the flag that are surrounded by
  // whitespace or the beginning/end of the string.
  for (std::string::size_type lpos = dflags.find(flag, 0);
       lpos != std::string::npos; lpos = dflags.find(flag, lpos)) {
    std::string::size_type rpos = lpos + len;
    if ((lpos <= 0 || cmIsSpace(dflags[lpos - 1])) &&
        (rpos >= dflags.size() || cmIsSpace(dflags[rpos]))) {
      dflags.erase(lpos, len);
    } else {
      ++lpos;
    }
  }
}